

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O1

void aom_highbd_v_predictor_16x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 4);
  uVar3 = *(undefined8 *)(above + 8);
  uVar4 = *(undefined8 *)(above + 0xc);
  iVar5 = 1;
  do {
    *(undefined8 *)dst = uVar1;
    *(undefined8 *)(dst + 4) = uVar2;
    *(undefined8 *)(dst + 8) = uVar3;
    *(undefined8 *)(dst + 0xc) = uVar4;
    *(undefined8 *)(dst + stride) = uVar1;
    *(undefined8 *)(dst + stride + 4) = uVar2;
    *(undefined8 *)(dst + stride + 8) = uVar3;
    *(undefined8 *)(dst + stride + 8 + 4) = uVar4;
    *(undefined8 *)(dst + stride * 2) = uVar1;
    *(undefined8 *)(dst + stride * 2 + 4) = uVar2;
    *(undefined8 *)(dst + stride * 2 + 8) = uVar3;
    *(undefined8 *)(dst + stride * 2 + 8 + 4) = uVar4;
    *(undefined8 *)(dst + stride * 3) = uVar1;
    *(undefined8 *)(dst + stride * 3 + 4) = uVar2;
    *(undefined8 *)(dst + stride * 3 + 8) = uVar3;
    *(undefined8 *)(dst + stride * 3 + 8 + 4) = uVar4;
    dst = dst + stride * 4;
    iVar5 = iVar5 + -1;
  } while (iVar5 == 0);
  return;
}

Assistant:

void aom_highbd_v_predictor_16x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                      const uint16_t *above,
                                      const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above0_u16 = _mm_load_si128((const __m128i *)above);
  const __m128i above1_u16 = _mm_load_si128((const __m128i *)(above + 8));
  int i;
  for (i = 0; i < 2; ++i) {
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    dst += stride;
  }
}